

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O0

int asn1_item_ex_i2d_opt
              (ASN1_VALUE **pval,uchar **out,ASN1_ITEM *it,int tag,int aclass,int optional)

{
  int iVar1;
  ASN1_VALUE **ppAVar2;
  ASN1_TEMPLATE *pAVar3;
  ASN1_VALUE **pseqval_1;
  ASN1_TEMPLATE *seqtt_1;
  int tmplen;
  ASN1_VALUE **pseqval;
  ASN1_TEMPLATE *seqtt;
  int ret;
  ASN1_EXTERN_FUNCS *ef;
  ASN1_VALUE **pchval;
  ASN1_TEMPLATE *chtt;
  int local_48;
  int seqlen;
  int seqcontlen;
  int i;
  ASN1_TEMPLATE *tt;
  int local_30;
  int optional_local;
  int aclass_local;
  int tag_local;
  ASN1_ITEM *it_local;
  uchar **out_local;
  ASN1_VALUE **pval_local;
  
  _seqcontlen = (ASN1_TEMPLATE *)0x0;
  tt._4_4_ = optional;
  local_30 = aclass;
  optional_local = tag;
  _aclass_local = it;
  it_local = (ASN1_ITEM *)out;
  out_local = (uchar **)pval;
  if ((aclass & 0xc0U) != aclass) {
    __assert_fail("(aclass & ASN1_TFLG_TAG_CLASS) == aclass",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x59,
                  "int asn1_item_ex_i2d_opt(ASN1_VALUE **, unsigned char **, const ASN1_ITEM *, int, int, int)"
                 );
  }
  if (tag == -1 && aclass != 0) {
    __assert_fail("tag != -1 || aclass == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x5b,
                  "int asn1_item_ex_i2d_opt(ASN1_VALUE **, unsigned char **, const ASN1_ITEM *, int, int, int)"
                 );
  }
  if ((it->itype == '\0') || (*pval != (ASN1_VALUE *)0x0)) {
    switch(it->itype) {
    case '\0':
      if (it->templates == (ASN1_TEMPLATE *)0x0) {
        pval_local._4_4_ = asn1_i2d_ex_primitive(pval,out,it,tag,aclass,optional);
      }
      else if ((it->templates->flags & 1) == 0) {
        pval_local._4_4_ = asn1_template_ex_i2d(pval,out,it->templates,tag,aclass,optional);
      }
      else {
        ERR_put_error(0xc,0,0xc1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                      ,0x6c);
        pval_local._4_4_ = -1;
      }
      break;
    case '\x01':
      iVar1 = asn1_enc_restore(&local_48,out,(ASN1_VALUE **)pval,(ASN1_ITEM *)it);
      if (iVar1 < 0) {
        pval_local._4_4_ = -1;
      }
      else if (iVar1 < 1) {
        local_48 = 0;
        if (optional_local == -1) {
          optional_local = 0x10;
          local_30 = 0;
        }
        seqlen = 0;
        _seqcontlen = (ASN1_TEMPLATE *)_aclass_local->templates;
        for (; (long)seqlen < _aclass_local->tcount; seqlen = seqlen + 1) {
          pAVar3 = asn1_do_adb((ASN1_VALUE **)out_local,_seqcontlen,1);
          if (pAVar3 == (ASN1_TEMPLATE *)0x0) {
            return -1;
          }
          ppAVar2 = asn1_get_field_ptr((ASN1_VALUE **)out_local,pAVar3);
          iVar1 = asn1_template_ex_i2d
                            ((ASN1_VALUE **)ppAVar2,(uchar **)0x0,(ASN1_TEMPLATE *)pAVar3,-1,0,0);
          if ((iVar1 == -1) || (0x7fffffff - local_48 < iVar1)) {
            return -1;
          }
          local_48 = iVar1 + local_48;
          _seqcontlen = (ASN1_TEMPLATE *)&_seqcontlen->item;
        }
        iVar1 = ASN1_object_size(1,local_48,optional_local);
        pval_local._4_4_ = iVar1;
        if ((it_local != (ASN1_ITEM *)0x0) && (iVar1 != -1)) {
          ASN1_put_object((uchar **)it_local,1,local_48,optional_local,local_30);
          seqlen = 0;
          _seqcontlen = (ASN1_TEMPLATE *)_aclass_local->templates;
          for (; (long)seqlen < _aclass_local->tcount; seqlen = seqlen + 1) {
            pAVar3 = asn1_do_adb((ASN1_VALUE **)out_local,_seqcontlen,1);
            if (pAVar3 == (ASN1_TEMPLATE *)0x0) {
              return -1;
            }
            ppAVar2 = asn1_get_field_ptr((ASN1_VALUE **)out_local,pAVar3);
            iVar1 = asn1_template_ex_i2d
                              ((ASN1_VALUE **)ppAVar2,(uchar **)it_local,(ASN1_TEMPLATE *)pAVar3,-1,
                               0,0);
            if (iVar1 < 0) {
              return -1;
            }
            _seqcontlen = (ASN1_TEMPLATE *)&_seqcontlen->item;
          }
        }
      }
      else {
        pval_local._4_4_ = local_48;
      }
      break;
    case '\x02':
      if (tag == -1) {
        seqlen = asn1_get_choice_selector((ASN1_VALUE **)pval,(ASN1_ITEM *)it);
        if ((seqlen < 0) || (_aclass_local->tcount <= (long)seqlen)) {
          ERR_put_error(0xc,0,0xa3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                        ,0x86);
          pval_local._4_4_ = -1;
        }
        else {
          pAVar3 = (ASN1_TEMPLATE *)(_aclass_local->templates + seqlen);
          if ((pAVar3->flags & 1) == 0) {
            ppAVar2 = asn1_get_field_ptr((ASN1_VALUE **)out_local,pAVar3);
            pval_local._4_4_ =
                 asn1_template_ex_i2d
                           ((ASN1_VALUE **)ppAVar2,(uchar **)it_local,(ASN1_TEMPLATE *)pAVar3,-1,0,0
                           );
          }
          else {
            ERR_put_error(0xc,0,0xc1,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                          ,0x8b);
            pval_local._4_4_ = -1;
          }
        }
      }
      else {
        ERR_put_error(0xc,0,0xc1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                      ,0x81);
        pval_local._4_4_ = -1;
      }
      break;
    default:
      ERR_put_error(0xc,0,0xc1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                    ,0xdf);
      pval_local._4_4_ = -1;
      break;
    case '\x04':
      if (tag == -1) {
        pval_local._4_4_ = (**(code **)((long)it->funcs + 0x18))(pval,out,it);
        if (pval_local._4_4_ == 0) {
          ERR_put_error(0xc,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                        ,0x9f);
          pval_local._4_4_ = -1;
        }
      }
      else {
        ERR_put_error(0xc,0,0xc1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                      ,0x95);
        pval_local._4_4_ = -1;
      }
      break;
    case '\x05':
      if (tag == -1) {
        pval_local._4_4_ = asn1_i2d_ex_primitive(pval,out,it,-1,0,optional);
      }
      else {
        ERR_put_error(0xc,0,0xc1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                      ,0x78);
        pval_local._4_4_ = -1;
      }
    }
  }
  else if (optional == 0) {
    ERR_put_error(0xc,0,0x9b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,99);
    pval_local._4_4_ = -1;
  }
  else {
    pval_local._4_4_ = 0;
  }
  return pval_local._4_4_;
}

Assistant:

int asn1_item_ex_i2d_opt(ASN1_VALUE **pval, unsigned char **out,
                         const ASN1_ITEM *it, int tag, int aclass,
                         int optional) {
  const ASN1_TEMPLATE *tt = NULL;
  int i, seqcontlen, seqlen;

  // Historically, |aclass| was repurposed to pass additional flags into the
  // encoding process.
  assert((aclass & ASN1_TFLG_TAG_CLASS) == aclass);
  // If not overridding the tag, |aclass| is ignored and should be zero.
  assert(tag != -1 || aclass == 0);

  // All fields are pointers, except for boolean |ASN1_ITYPE_PRIMITIVE|s.
  // Optional primitives are handled later.
  if ((it->itype != ASN1_ITYPE_PRIMITIVE) && !*pval) {
    if (optional) {
      return 0;
    }
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_MISSING_VALUE);
    return -1;
  }

  switch (it->itype) {
    case ASN1_ITYPE_PRIMITIVE:
      if (it->templates) {
        // This is an |ASN1_ITEM_TEMPLATE|.
        if (it->templates->flags & ASN1_TFLG_OPTIONAL) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
          return -1;
        }
        return asn1_template_ex_i2d(pval, out, it->templates, tag, aclass,
                                    optional);
      }
      return asn1_i2d_ex_primitive(pval, out, it, tag, aclass, optional);

    case ASN1_ITYPE_MSTRING:
      // It never makes sense for multi-strings to have implicit tagging, so
      // if tag != -1, then this looks like an error in the template.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        return -1;
      }
      return asn1_i2d_ex_primitive(pval, out, it, -1, 0, optional);

    case ASN1_ITYPE_CHOICE: {
      // It never makes sense for CHOICE types to have implicit tagging, so if
      // tag != -1, then this looks like an error in the template.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        return -1;
      }
      i = asn1_get_choice_selector(pval, it);
      if (i < 0 || i >= it->tcount) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NO_MATCHING_CHOICE_TYPE);
        return -1;
      }
      const ASN1_TEMPLATE *chtt = it->templates + i;
      if (chtt->flags & ASN1_TFLG_OPTIONAL) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        return -1;
      }
      ASN1_VALUE **pchval = asn1_get_field_ptr(pval, chtt);
      return asn1_template_ex_i2d(pchval, out, chtt, -1, 0, /*optional=*/0);
    }

    case ASN1_ITYPE_EXTERN: {
      // We don't support implicit tagging with external types.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        return -1;
      }
      const ASN1_EXTERN_FUNCS *ef =
          reinterpret_cast<const ASN1_EXTERN_FUNCS *>(it->funcs);
      int ret = ef->asn1_ex_i2d(pval, out, it);
      if (ret == 0) {
        // |asn1_ex_i2d| should never return zero. We have already checked
        // for optional values generically, and |ASN1_ITYPE_EXTERN| fields
        // must be pointers.
        OPENSSL_PUT_ERROR(ASN1, ERR_R_INTERNAL_ERROR);
        return -1;
      }
      return ret;
    }

    case ASN1_ITYPE_SEQUENCE: {
      i = asn1_enc_restore(&seqcontlen, out, pval, it);
      // An error occurred
      if (i < 0) {
        return -1;
      }
      // We have a valid cached encoding...
      if (i > 0) {
        return seqcontlen;
      }
      // Otherwise carry on
      seqcontlen = 0;
      // If no IMPLICIT tagging set to SEQUENCE, UNIVERSAL
      if (tag == -1) {
        tag = V_ASN1_SEQUENCE;
        aclass = V_ASN1_UNIVERSAL;
      }
      // First work out sequence content length
      for (i = 0, tt = it->templates; i < it->tcount; tt++, i++) {
        const ASN1_TEMPLATE *seqtt;
        ASN1_VALUE **pseqval;
        int tmplen;
        seqtt = asn1_do_adb(pval, tt, 1);
        if (!seqtt) {
          return -1;
        }
        pseqval = asn1_get_field_ptr(pval, seqtt);
        tmplen =
            asn1_template_ex_i2d(pseqval, NULL, seqtt, -1, 0, /*optional=*/0);
        if (tmplen == -1 || (tmplen > INT_MAX - seqcontlen)) {
          return -1;
        }
        seqcontlen += tmplen;
      }

      seqlen = ASN1_object_size(/*constructed=*/1, seqcontlen, tag);
      if (!out || seqlen == -1) {
        return seqlen;
      }
      // Output SEQUENCE header
      ASN1_put_object(out, /*constructed=*/1, seqcontlen, tag, aclass);
      for (i = 0, tt = it->templates; i < it->tcount; tt++, i++) {
        const ASN1_TEMPLATE *seqtt;
        ASN1_VALUE **pseqval;
        seqtt = asn1_do_adb(pval, tt, 1);
        if (!seqtt) {
          return -1;
        }
        pseqval = asn1_get_field_ptr(pval, seqtt);
        if (asn1_template_ex_i2d(pseqval, out, seqtt, -1, 0, /*optional=*/0) <
            0) {
          return -1;
        }
      }
      return seqlen;
    }

    default:
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
      return -1;
  }
}